

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkaccessmanager.cpp
# Opt level: O1

void __thiscall
QNetworkAccessManagerPrivate::_q_replyFinished
          (QNetworkAccessManagerPrivate *this,QNetworkReply *reply)

{
  char cVar1;
  QSlotObjectBase *pQVar2;
  long in_FS_OFFSET;
  undefined1 local_80 [8];
  QVariant local_78;
  undefined1 local_58 [16];
  QMetaTypeInterface *local_48 [3];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._8_8_ = &local_78;
  local_58._0_8_ = (PrivateShared *)0x0;
  local_78.d.data.shared = (PrivateShared *)reply;
  QMetaObject::activate
            (*(QObject **)&this->field_0x8,&QNetworkAccessManager::staticMetaObject,2,
             (void **)local_58);
  QNetworkReply::request((QNetworkReply *)local_80);
  QVariant::QVariant(&local_78,false);
  QNetworkRequest::attribute
            ((QVariant *)local_58,(QNetworkRequest *)local_80,AutoDeleteReplyOnFinishAttribute,
             &local_78);
  cVar1 = QVariant::toBool();
  QVariant::~QVariant((QVariant *)local_58);
  QVariant::~QVariant(&local_78);
  QNetworkRequest::~QNetworkRequest((QNetworkRequest *)local_80);
  if (cVar1 != '\0') {
    local_58._0_8_ = (PrivateShared *)0x0;
    local_58._8_8_ = (QVariant *)0x0;
    local_48[0] = &QtPrivate::QMetaTypeInterfaceWrapper<void>::metaType;
    pQVar2 = (QSlotObjectBase *)operator_new(0x18);
    (pQVar2->m_ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i = 1;
    pQVar2->m_impl =
         QtPrivate::
         QCallableObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/network/access/qnetworkaccessmanager.cpp:1536:42),_QtPrivate::List<>,_void>
         ::impl;
    *(QNetworkReply **)(pQVar2 + 1) = reply;
    QMetaObject::invokeMethodImpl
              ((QObject *)reply,pQVar2,QueuedConnection,1,(void **)local_58,(char **)(local_58 + 8),
               local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QNetworkAccessManagerPrivate::_q_replyFinished(QNetworkReply *reply)
{
    Q_Q(QNetworkAccessManager);

    emit q->finished(reply);
    if (reply->request().attribute(QNetworkRequest::AutoDeleteReplyOnFinishAttribute, false).toBool())
        QMetaObject::invokeMethod(reply, [reply] { reply->deleteLater(); }, Qt::QueuedConnection);
}